

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

SQInteger __thiscall SQFunctionProto::GetLine(SQFunctionProto *this,SQInstruction *curr)

{
  SQLineInfo *pSVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  SQInteger *pSVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  pSVar1 = this->_lineinfos;
  if (0 < this->_nlineinfos) {
    lVar6 = (long)curr + (-0xe0 - (long)this) >> 3;
    lVar4 = this->_nlineinfos + -1;
    lVar8 = lVar4;
    lVar10 = 0;
    do {
      lVar9 = lVar10;
      lVar7 = lVar8 - lVar9 >> 1;
      lVar3 = lVar7 + lVar9;
      if (lVar6 < pSVar1[lVar3]._op) {
        lVar8 = lVar3 + -1;
        lVar10 = lVar9;
      }
      else {
        if ((lVar6 <= pSVar1[lVar3]._op) || ((lVar3 < lVar4 && (lVar6 <= pSVar1[lVar3 + 1]._op))))
        break;
        lVar10 = lVar3 + 1;
      }
    } while (lVar10 <= lVar8);
    if (lVar3 < 1) goto LAB_0015250c;
    pSVar5 = &pSVar1[lVar7 + lVar9]._op;
    do {
      if (*pSVar5 < lVar6) goto LAB_0015250c;
      pSVar5 = pSVar5 + -2;
      bVar2 = 1 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
  }
  lVar3 = 0;
LAB_0015250c:
  return pSVar1[lVar3]._line;
}

Assistant:

SQInteger SQFunctionProto::GetLine(SQInstruction *curr)
{
    SQInteger op = (SQInteger)(curr-_instructions);
    SQInteger line=_lineinfos[0]._line;
    SQInteger low = 0;
    SQInteger high = _nlineinfos - 1;
    SQInteger mid = 0;
    while(low <= high)
    {
        mid = low + ((high - low) >> 1);
        SQInteger curop = _lineinfos[mid]._op;
        if(curop > op)
        {
            high = mid - 1;
        }
        else if(curop < op) {
            if(mid < (_nlineinfos - 1)
                && _lineinfos[mid + 1]._op >= op) {
                break;
            }
            low = mid + 1;
        }
        else { //equal
            break;
        }
    }

    while(mid > 0 && _lineinfos[mid]._op >= op) mid--;

    line = _lineinfos[mid]._line;

    return line;
}